

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O2

void fadst8x8_new_avx2(__m256i *input,__m256i *output,int8_t cos_bit)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  __m256i alVar4;
  __m256i alVar5;
  __m256i alVar6;
  __m256i w0;
  __m256i w0_00;
  __m256i w0_01;
  __m256i w0_02;
  __m256i w0_03;
  __m256i w1;
  __m256i w1_00;
  __m256i w1_01;
  __m256i w1_02;
  __m256i w1_03;
  __m256i w1_04;
  __m256i w1_05;
  __m256i w1_06;
  __m256i _r;
  __m256i _r_00;
  __m256i _r_01;
  __m256i _r_02;
  __m256i _r_03;
  __m256i _r_04;
  __m256i _r_05;
  __m256i _r_06;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  longlong lVar10;
  longlong lVar11;
  longlong lVar12;
  longlong lVar13;
  longlong lVar14;
  longlong lVar15;
  longlong lVar16;
  longlong lVar17;
  longlong lVar18;
  longlong lVar19;
  longlong lVar20;
  longlong lVar21;
  longlong lVar22;
  longlong lVar23;
  longlong lVar24;
  longlong lVar25;
  longlong lVar26;
  longlong lVar27;
  longlong lVar28;
  longlong lVar29;
  longlong lVar30;
  longlong lVar31;
  longlong lVar32;
  longlong lVar33;
  long lVar34;
  int cos_bit_00;
  int iVar35;
  undefined7 in_register_00000011;
  int32_t iVar36;
  undefined1 auVar37 [32];
  __m256i x5 [8];
  __m256i x1 [8];
  __m256i x3 [8];
  undefined1 in_stack_fffffffffffff9e0 [24];
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  undefined1 in_stack_fffffffffffffa20 [24];
  __m256i local_360;
  __m256i local_340;
  __m256i local_320;
  __m256i local_300;
  __m256i local_2e0;
  __m256i local_2c0;
  __m256i local_2a0;
  __m256i local_280;
  longlong local_260;
  longlong lStack_258;
  longlong lStack_250;
  longlong lStack_248;
  undefined1 local_240 [32];
  __m256i local_220;
  longlong local_200;
  longlong lStack_1f8;
  longlong lStack_1f0;
  longlong lStack_1e8;
  undefined1 local_1e0 [32];
  longlong local_1c0;
  longlong lStack_1b8;
  longlong lStack_1b0;
  longlong lStack_1a8;
  longlong local_1a0;
  longlong lStack_198;
  longlong lStack_190;
  longlong lStack_188;
  __m256i local_180;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  __m256i local_e0;
  __m256i local_c0;
  __m256i local_a0;
  __m256i local_80 [2];
  
  cos_bit_00 = (int)CONCAT71(in_register_00000011,cos_bit);
  lVar34 = (long)cos_bit_00;
  iVar35 = 1 << (cos_bit - 1U & 0x1f);
  local_260 = (*input)[0];
  lStack_258 = (*input)[1];
  lStack_250 = (*input)[2];
  lStack_248 = (*input)[3];
  alVar6 = *input;
  auVar37 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  auVar2 = vpsubsw_avx2(auVar37,(undefined1  [32])input[7]);
  local_220 = (__m256i)vpsubsw_avx2(auVar37,(undefined1  [32])input[3]);
  local_200 = input[4][0];
  lStack_1f8 = input[4][1];
  lStack_1f0 = input[4][2];
  lStack_1e8 = input[4][3];
  local_1e0 = vpsubsw_avx2(auVar37,(undefined1  [32])input[1]);
  local_1c0 = input[6][0];
  lStack_1b8 = input[6][1];
  lStack_1b0 = input[6][2];
  lStack_1a8 = input[6][3];
  local_1a0 = input[2][0];
  lStack_198 = input[2][1];
  lStack_190 = input[2][2];
  lStack_188 = input[2][3];
  local_180 = (__m256i)vpsubsw_avx2(auVar37,(undefined1  [32])input[5]);
  alVar4[3] = lVar34;
  alVar4._0_24_ = in_stack_fffffffffffff9e0;
  w1[0]._4_4_ = iVar35;
  w1[0]._0_4_ = iVar35;
  w1[1]._0_4_ = iVar35;
  w1[1]._4_4_ = iVar35;
  w1[2]._0_4_ = iVar35;
  w1[2]._4_4_ = iVar35;
  w1[3]._0_4_ = iVar35;
  w1[3]._4_4_ = iVar35;
  _r[3] = (longlong)output;
  _r._0_24_ = in_stack_fffffffffffffa20;
  iVar38 = iVar35;
  iVar39 = iVar35;
  iVar40 = iVar35;
  iVar41 = iVar35;
  iVar42 = iVar35;
  iVar43 = iVar35;
  iVar44 = iVar35;
  local_240 = auVar2;
  btf_16_w16_avx2(alVar4,w1,&local_220,(__m256i *)&local_200,_r,cos_bit_00);
  lVar17 = lStack_1a8;
  lVar16 = lStack_1b0;
  lVar15 = lStack_1b8;
  lVar14 = local_1c0;
  auVar7 = local_1e0;
  lVar13 = lStack_1e8;
  lVar12 = lStack_1f0;
  lVar11 = lStack_1f8;
  lVar10 = local_200;
  alVar4 = local_220;
  alVar5[3] = lVar34;
  alVar5[0] = in_stack_fffffffffffff9e0._0_8_;
  alVar5[1] = in_stack_fffffffffffff9e0._8_8_;
  alVar5[2] = in_stack_fffffffffffff9e0._16_8_;
  w1_00[0]._4_4_ = iVar38;
  w1_00[0]._0_4_ = iVar35;
  w1_00[1]._0_4_ = iVar39;
  w1_00[1]._4_4_ = iVar40;
  w1_00[2]._0_4_ = iVar41;
  w1_00[2]._4_4_ = iVar42;
  w1_00[3]._0_4_ = iVar43;
  w1_00[3]._4_4_ = iVar44;
  _r_00[3] = (longlong)output;
  _r_00[0] = in_stack_fffffffffffffa20._0_8_;
  _r_00[1] = in_stack_fffffffffffffa20._8_8_;
  _r_00[2] = in_stack_fffffffffffffa20._16_8_;
  btf_16_w16_avx2(alVar5,w1_00,(__m256i *)&local_1a0,&local_180,_r_00,cos_bit_00);
  auVar9._8_8_ = lStack_198;
  auVar9._0_8_ = local_1a0;
  auVar9._16_8_ = lStack_190;
  auVar9._24_8_ = lStack_188;
  auVar37 = vpaddsw_avx2((undefined1  [32])alVar6,(undefined1  [32])alVar4);
  auVar3 = vpsubsw_avx2((undefined1  [32])alVar6,(undefined1  [32])alVar4);
  auVar8._8_8_ = lVar11;
  auVar8._0_8_ = lVar10;
  auVar8._16_8_ = lVar12;
  auVar8._24_8_ = lVar13;
  auVar1 = vpaddsw_avx2(auVar2,auVar8);
  auVar2 = vpsubsw_avx2(auVar2,auVar8);
  local_e0 = (__m256i)vpaddsw_avx2(auVar7,auVar9);
  local_a0 = (__m256i)vpsubsw_avx2(auVar7,auVar9);
  auVar7._8_8_ = lVar15;
  auVar7._0_8_ = lVar14;
  auVar7._16_8_ = lVar16;
  auVar7._24_8_ = lVar17;
  local_c0 = (__m256i)vpaddsw_avx2(auVar7,(undefined1  [32])local_180);
  local_80[0] = (__m256i)vpsubsw_avx2(auVar7,(undefined1  [32])local_180);
  iVar36 = (int32_t)lVar34;
  alVar6[3] = lVar34;
  alVar6[0] = in_stack_fffffffffffff9e0._0_8_;
  alVar6[1] = in_stack_fffffffffffff9e0._8_8_;
  alVar6[2] = in_stack_fffffffffffff9e0._16_8_;
  w1_01[0]._4_4_ = iVar38;
  w1_01[0]._0_4_ = iVar35;
  w1_01[1]._0_4_ = iVar39;
  w1_01[1]._4_4_ = iVar40;
  w1_01[2]._0_4_ = iVar41;
  w1_01[2]._4_4_ = iVar42;
  w1_01[3]._0_4_ = iVar43;
  w1_01[3]._4_4_ = iVar44;
  _r_01[3] = (longlong)output;
  _r_01[0] = in_stack_fffffffffffffa20._0_8_;
  _r_01[1] = in_stack_fffffffffffffa20._8_8_;
  _r_01[2] = in_stack_fffffffffffffa20._16_8_;
  local_160 = auVar37;
  local_140 = auVar1;
  local_120 = auVar3;
  local_100 = auVar2;
  btf_16_w16_avx2(alVar6,w1_01,&local_e0,&local_c0,_r_01,iVar36);
  alVar5 = local_c0;
  alVar4 = local_e0;
  w0[3] = lVar34;
  w0[0] = in_stack_fffffffffffff9e0._0_8_;
  w0[1] = in_stack_fffffffffffff9e0._8_8_;
  w0[2] = in_stack_fffffffffffff9e0._16_8_;
  w1_02[0]._4_4_ = iVar38;
  w1_02[0]._0_4_ = iVar35;
  w1_02[1]._0_4_ = iVar39;
  w1_02[1]._4_4_ = iVar40;
  w1_02[2]._0_4_ = iVar41;
  w1_02[2]._4_4_ = iVar42;
  w1_02[3]._0_4_ = iVar43;
  w1_02[3]._4_4_ = iVar44;
  _r_02[3] = (longlong)output;
  _r_02[0] = in_stack_fffffffffffffa20._0_8_;
  _r_02[1] = in_stack_fffffffffffffa20._8_8_;
  _r_02[2] = in_stack_fffffffffffffa20._16_8_;
  btf_16_w16_avx2(w0,w1_02,&local_a0,local_80,_r_02,iVar36);
  local_360 = (__m256i)vpaddsw_avx2(auVar37,(undefined1  [32])alVar4);
  local_2e0 = (__m256i)vpsubsw_avx2(auVar37,(undefined1  [32])alVar4);
  local_340 = (__m256i)vpaddsw_avx2(auVar1,(undefined1  [32])alVar5);
  local_2c0 = (__m256i)vpsubsw_avx2(auVar1,(undefined1  [32])alVar5);
  local_320 = (__m256i)vpaddsw_avx2(auVar3,(undefined1  [32])local_a0);
  local_2a0 = (__m256i)vpsubsw_avx2(auVar3,(undefined1  [32])local_a0);
  local_300 = (__m256i)vpaddsw_avx2(auVar2,(undefined1  [32])local_80[0]);
  local_280 = (__m256i)vpsubsw_avx2(auVar2,(undefined1  [32])local_80[0]);
  iVar36 = (int32_t)lVar34;
  w0_00[3] = lVar34;
  w0_00[0] = in_stack_fffffffffffff9e0._0_8_;
  w0_00[1] = in_stack_fffffffffffff9e0._8_8_;
  w0_00[2] = in_stack_fffffffffffff9e0._16_8_;
  w1_03[0]._4_4_ = iVar38;
  w1_03[0]._0_4_ = iVar35;
  w1_03[1]._0_4_ = iVar39;
  w1_03[1]._4_4_ = iVar40;
  w1_03[2]._0_4_ = iVar41;
  w1_03[2]._4_4_ = iVar42;
  w1_03[3]._0_4_ = iVar43;
  w1_03[3]._4_4_ = iVar44;
  _r_03[3] = (longlong)output;
  _r_03[0] = in_stack_fffffffffffffa20._0_8_;
  _r_03[1] = in_stack_fffffffffffffa20._8_8_;
  _r_03[2] = in_stack_fffffffffffffa20._16_8_;
  btf_16_w16_avx2(w0_00,w1_03,&local_360,&local_340,_r_03,iVar36);
  lVar10 = local_360[0];
  lVar11 = local_360[1];
  lVar12 = local_360[2];
  lVar13 = local_360[3];
  lVar14 = local_340[0];
  lVar15 = local_340[1];
  lVar16 = local_340[2];
  lVar17 = local_340[3];
  w0_01[3] = lVar34;
  w0_01[0] = in_stack_fffffffffffff9e0._0_8_;
  w0_01[1] = in_stack_fffffffffffff9e0._8_8_;
  w0_01[2] = in_stack_fffffffffffff9e0._16_8_;
  w1_04[0]._4_4_ = iVar38;
  w1_04[0]._0_4_ = iVar35;
  w1_04[1]._0_4_ = iVar39;
  w1_04[1]._4_4_ = iVar40;
  w1_04[2]._0_4_ = iVar41;
  w1_04[2]._4_4_ = iVar42;
  w1_04[3]._0_4_ = iVar43;
  w1_04[3]._4_4_ = iVar44;
  _r_04[3] = (longlong)output;
  _r_04[0] = in_stack_fffffffffffffa20._0_8_;
  _r_04[1] = in_stack_fffffffffffffa20._8_8_;
  _r_04[2] = in_stack_fffffffffffffa20._16_8_;
  btf_16_w16_avx2(w0_01,w1_04,&local_320,&local_300,_r_04,iVar36);
  lVar18 = local_320[0];
  lVar19 = local_320[1];
  lVar20 = local_320[2];
  lVar21 = local_320[3];
  lVar22 = local_300[0];
  lVar23 = local_300[1];
  lVar24 = local_300[2];
  lVar25 = local_300[3];
  w0_02[3] = lVar34;
  w0_02[0] = in_stack_fffffffffffff9e0._0_8_;
  w0_02[1] = in_stack_fffffffffffff9e0._8_8_;
  w0_02[2] = in_stack_fffffffffffff9e0._16_8_;
  w1_05[0]._4_4_ = iVar38;
  w1_05[0]._0_4_ = iVar35;
  w1_05[1]._0_4_ = iVar39;
  w1_05[1]._4_4_ = iVar40;
  w1_05[2]._0_4_ = iVar41;
  w1_05[2]._4_4_ = iVar42;
  w1_05[3]._0_4_ = iVar43;
  w1_05[3]._4_4_ = iVar44;
  _r_05[3] = (longlong)output;
  _r_05[0] = in_stack_fffffffffffffa20._0_8_;
  _r_05[1] = in_stack_fffffffffffffa20._8_8_;
  _r_05[2] = in_stack_fffffffffffffa20._16_8_;
  btf_16_w16_avx2(w0_02,w1_05,&local_2e0,&local_2c0,_r_05,iVar36);
  lVar26 = local_2e0[0];
  lVar27 = local_2e0[1];
  lVar28 = local_2e0[2];
  lVar29 = local_2e0[3];
  lVar30 = local_2c0[0];
  lVar31 = local_2c0[1];
  lVar32 = local_2c0[2];
  lVar33 = local_2c0[3];
  w0_03[3] = lVar34;
  w0_03[0] = in_stack_fffffffffffff9e0._0_8_;
  w0_03[1] = in_stack_fffffffffffff9e0._8_8_;
  w0_03[2] = in_stack_fffffffffffff9e0._16_8_;
  w1_06[0]._4_4_ = iVar38;
  w1_06[0]._0_4_ = iVar35;
  w1_06[1]._0_4_ = iVar39;
  w1_06[1]._4_4_ = iVar40;
  w1_06[2]._0_4_ = iVar41;
  w1_06[2]._4_4_ = iVar42;
  w1_06[3]._0_4_ = iVar43;
  w1_06[3]._4_4_ = iVar44;
  _r_06[3] = (longlong)output;
  _r_06[0] = in_stack_fffffffffffffa20._0_8_;
  _r_06[1] = in_stack_fffffffffffffa20._8_8_;
  _r_06[2] = in_stack_fffffffffffffa20._16_8_;
  btf_16_w16_avx2(w0_03,w1_06,&local_2a0,&local_280,_r_06,iVar36);
  (*output)[0] = lVar14;
  (*output)[1] = lVar15;
  (*output)[2] = lVar16;
  (*output)[3] = lVar17;
  output[1][0] = local_2a0[0];
  output[1][1] = local_2a0[1];
  output[1][2] = local_2a0[2];
  output[1][3] = local_2a0[3];
  output[2][0] = lVar22;
  output[2][1] = lVar23;
  output[2][2] = lVar24;
  output[2][3] = lVar25;
  output[3][0] = lVar26;
  output[3][1] = lVar27;
  output[3][2] = lVar28;
  output[3][3] = lVar29;
  output[4][0] = lVar30;
  output[4][1] = lVar31;
  output[4][2] = lVar32;
  output[4][3] = lVar33;
  output[5][0] = lVar18;
  output[5][1] = lVar19;
  output[5][2] = lVar20;
  output[5][3] = lVar21;
  output[6][0] = local_280[0];
  output[6][1] = local_280[1];
  output[6][2] = local_280[2];
  output[6][3] = local_280[3];
  output[7][0] = lVar10;
  output[7][1] = lVar11;
  output[7][2] = lVar12;
  output[7][3] = lVar13;
  return;
}

Assistant:

static inline void fadst8x8_new_avx2(const __m256i *input, __m256i *output,
                                     int8_t cos_bit) {
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m256i __zero = _mm256_setzero_si256();
  const __m256i __rounding = _mm256_set1_epi32(1 << (cos_bit - 1));

  __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  __m256i cospi_p32_m32 = pair_set_w16_epi16(cospi[32], -cospi[32]);
  __m256i cospi_p16_p48 = pair_set_w16_epi16(cospi[16], cospi[48]);
  __m256i cospi_p48_m16 = pair_set_w16_epi16(cospi[48], -cospi[16]);
  __m256i cospi_m48_p16 = pair_set_w16_epi16(-cospi[48], cospi[16]);
  __m256i cospi_p04_p60 = pair_set_w16_epi16(cospi[4], cospi[60]);
  __m256i cospi_p60_m04 = pair_set_w16_epi16(cospi[60], -cospi[4]);
  __m256i cospi_p20_p44 = pair_set_w16_epi16(cospi[20], cospi[44]);
  __m256i cospi_p44_m20 = pair_set_w16_epi16(cospi[44], -cospi[20]);
  __m256i cospi_p36_p28 = pair_set_w16_epi16(cospi[36], cospi[28]);
  __m256i cospi_p28_m36 = pair_set_w16_epi16(cospi[28], -cospi[36]);
  __m256i cospi_p52_p12 = pair_set_w16_epi16(cospi[52], cospi[12]);
  __m256i cospi_p12_m52 = pair_set_w16_epi16(cospi[12], -cospi[52]);

  // stage 1
  __m256i x1[8];
  x1[0] = input[0];
  x1[1] = _mm256_subs_epi16(__zero, input[7]);
  x1[2] = _mm256_subs_epi16(__zero, input[3]);
  x1[3] = input[4];
  x1[4] = _mm256_subs_epi16(__zero, input[1]);
  x1[5] = input[6];
  x1[6] = input[2];
  x1[7] = _mm256_subs_epi16(__zero, input[5]);

  // stage 2
  __m256i x2[8];
  x2[0] = x1[0];
  x2[1] = x1[1];
  btf_16_w16_avx2(cospi_p32_p32, cospi_p32_m32, &x1[2], &x1[3], __rounding,
                  cos_bit);
  x2[2] = x1[2];
  x2[3] = x1[3];
  x2[4] = x1[4];
  x2[5] = x1[5];
  btf_16_w16_avx2(cospi_p32_p32, cospi_p32_m32, &x1[6], &x1[7], __rounding,
                  cos_bit);
  x2[6] = x1[6];
  x2[7] = x1[7];

  // stage 3
  __m256i x3[8];
  x3[0] = _mm256_adds_epi16(x2[0], x2[2]);
  x3[2] = _mm256_subs_epi16(x2[0], x2[2]);
  x3[1] = _mm256_adds_epi16(x2[1], x2[3]);
  x3[3] = _mm256_subs_epi16(x2[1], x2[3]);
  x3[4] = _mm256_adds_epi16(x2[4], x2[6]);
  x3[6] = _mm256_subs_epi16(x2[4], x2[6]);
  x3[5] = _mm256_adds_epi16(x2[5], x2[7]);
  x3[7] = _mm256_subs_epi16(x2[5], x2[7]);

  // stage 4
  __m256i x4[8];
  x4[0] = x3[0];
  x4[1] = x3[1];
  x4[2] = x3[2];
  x4[3] = x3[3];
  btf_16_w16_avx2(cospi_p16_p48, cospi_p48_m16, &x3[4], &x3[5], __rounding,
                  cos_bit);
  x4[4] = x3[4];
  x4[5] = x3[5];
  btf_16_w16_avx2(cospi_m48_p16, cospi_p16_p48, &x3[6], &x3[7], __rounding,
                  cos_bit);
  x4[6] = x3[6];
  x4[7] = x3[7];

  // stage 5
  __m256i x5[8];
  x5[0] = _mm256_adds_epi16(x4[0], x4[4]);
  x5[4] = _mm256_subs_epi16(x4[0], x4[4]);
  x5[1] = _mm256_adds_epi16(x4[1], x4[5]);
  x5[5] = _mm256_subs_epi16(x4[1], x4[5]);
  x5[2] = _mm256_adds_epi16(x4[2], x4[6]);
  x5[6] = _mm256_subs_epi16(x4[2], x4[6]);
  x5[3] = _mm256_adds_epi16(x4[3], x4[7]);
  x5[7] = _mm256_subs_epi16(x4[3], x4[7]);

  // stage 6
  __m256i x6[8];
  btf_16_w16_avx2(cospi_p04_p60, cospi_p60_m04, &x5[0], &x5[1], __rounding,
                  cos_bit);
  x6[0] = x5[0];
  x6[1] = x5[1];
  btf_16_w16_avx2(cospi_p20_p44, cospi_p44_m20, &x5[2], &x5[3], __rounding,
                  cos_bit);
  x6[2] = x5[2];
  x6[3] = x5[3];
  btf_16_w16_avx2(cospi_p36_p28, cospi_p28_m36, &x5[4], &x5[5], __rounding,
                  cos_bit);
  x6[4] = x5[4];
  x6[5] = x5[5];
  btf_16_w16_avx2(cospi_p52_p12, cospi_p12_m52, &x5[6], &x5[7], __rounding,
                  cos_bit);
  x6[6] = x5[6];
  x6[7] = x5[7];

  // stage 7
  output[0] = x6[1];
  output[1] = x6[6];
  output[2] = x6[3];
  output[3] = x6[4];
  output[4] = x6[5];
  output[5] = x6[2];
  output[6] = x6[7];
  output[7] = x6[0];
}